

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintInt64_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,int64 val)

{
  StringBaseTextGenerator generator;
  BaseTextGenerator local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_006777b0;
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  FastFieldValuePrinter::PrintInt64((FastFieldValuePrinter *)__return_storage_ptr__,val,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_006777b0;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintInt64(int64 val) const {
  FORWARD_IMPL(PrintInt64, val);
}